

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void Commands::DropItem(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from)

{
  pointer pbVar1;
  World *pWVar2;
  int iVar3;
  int amount;
  uint num;
  uint num_00;
  int iVar4;
  mapped_type *this;
  short item_00;
  double dVar5;
  PacketBuilder reply;
  shared_ptr<Map_Item> item;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  double local_38;
  
  if (from->trading == false) {
    iVar3 = util::to_int((arguments->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pbVar1 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    amount = 1;
    if (0x20 < (ulong)((long)(arguments->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
      amount = util::to_int(pbVar1 + 1);
    }
    pbVar1 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
      num = (uint)from->x;
    }
    else {
      num = util::to_int(pbVar1 + 2);
    }
    pbVar1 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x61) {
      num_00 = (uint)from->y;
    }
    else {
      num_00 = util::to_int(pbVar1 + 3);
    }
    if (0 < amount) {
      item_00 = (short)iVar3;
      iVar4 = Character::HasItem(from,item_00,false);
      if (amount <= iVar4) {
        Map::AddItem((Map *)local_48,(short)from->map,(int)item_00,(uchar)amount,(uchar)num,
                     (Character *)(ulong)(num_00 & 0xff));
        if ((World *)local_48._0_8_ != (World *)0x0) {
          iVar4 = Character::PlayerID(from);
          *(int *)((long)&(((Timer *)(local_48._0_8_ + 8))->impl)._M_t.
                          super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>
                          .super__Head_base<0UL,_Timer::impl_t_*,_false> + 4) = iVar4;
          local_38 = Timer::GetTime();
          pWVar2 = from->world;
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"ProtectPlayerDrop","")
          ;
          this = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,(key_type *)local_78);
          dVar5 = util::variant::GetFloat(this);
          *(double *)&(((Timer *)(local_48._0_8_ + 8))->timers)._M_t._M_impl = local_38 + dVar5;
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          Character::DelItem(from,item_00,amount);
          PacketBuilder::PacketBuilder((PacketBuilder *)local_78,PACKET_ITEM,PACKET_DROP,0xf);
          PacketBuilder::AddShort((PacketBuilder *)local_78,iVar3);
          PacketBuilder::AddThree((PacketBuilder *)local_78,amount);
          iVar3 = Character::HasItem(from,item_00,false);
          PacketBuilder::AddInt((PacketBuilder *)local_78,iVar3);
          PacketBuilder::AddShort((PacketBuilder *)local_78,(int)(short)*(int *)local_48._0_8_);
          PacketBuilder::AddChar((PacketBuilder *)local_78,num);
          PacketBuilder::AddChar((PacketBuilder *)local_78,num_00);
          PacketBuilder::AddChar((PacketBuilder *)local_78,from->weight);
          PacketBuilder::AddChar((PacketBuilder *)local_78,from->maxweight);
          Character::Send(from,(PacketBuilder *)local_78);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_78);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
        }
      }
    }
  }
  return;
}

Assistant:

void DropItem(const std::vector<std::string>& arguments, Character* from)
{
	if (from->trading) return;

	int id = util::to_int(arguments[0]);
	int amount = (arguments.size() >= 2) ? util::to_int(arguments[1]) : 1;
	int x = (arguments.size() >= 3) ? util::to_int(arguments[2]) : from->x;
	int y = (arguments.size() >= 4) ? util::to_int(arguments[3]) : from->y;

	if (amount > 0 && from->HasItem(id) >= amount)
	{
		std::shared_ptr<Map_Item> item = from->map->AddItem(id, amount, x, y, from);

		if (item)
		{
			item->owner = from->PlayerID();
			item->unprotecttime = Timer::GetTime() + double(from->world->config["ProtectPlayerDrop"]);
			from->DelItem(id, amount);

			PacketBuilder reply(PACKET_ITEM, PACKET_DROP, 15);
			reply.AddShort(id);
			reply.AddThree(amount);
			reply.AddInt(from->HasItem(id));
			reply.AddShort(item->uid);
			reply.AddChar(x);
			reply.AddChar(y);
			reply.AddChar(from->weight);
			reply.AddChar(from->maxweight);
			from->Send(reply);
		}
	}
}